

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

void __thiscall embree::OBJLoader::flushHairGroup(OBJLoader *this)

{
  ulong uVar1;
  size_type sVar2;
  __int_type _Var3;
  long *plVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  size_type sVar9;
  unsigned_long *puVar10;
  HairSetNode *pHVar11;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  uchar *tbs;
  size_t in_R9;
  Ref<embree::SceneGraph::HairSetNode> mesh;
  size_t j;
  size_t i;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  curves;
  avector<Vec3ff> vertices;
  Vec3fx v;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  Vec3fx *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffffca8;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffffcb0;
  GroupNode *in_stack_fffffffffffffcb8;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffffcc0;
  pointer pvVar12;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffffd20;
  HairSetNode *in_stack_fffffffffffffd28;
  HairSetNode *in_stack_fffffffffffffd30;
  undefined1 local_288 [24];
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_270;
  ulong local_250;
  ulong local_248;
  undefined1 local_228 [96];
  MaterialNode *local_1c8;
  undefined1 *local_1b8;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_190;
  pointer local_180;
  reference local_178;
  HairSetNode *local_170;
  pointer local_168;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  pointer local_148;
  __atomic_base<unsigned_long> local_128;
  Ref<embree::SceneGraph::MaterialNode> local_120;
  ulong local_118;
  size_type local_110;
  MaterialNode *local_108;
  undefined1 *local_e8;
  undefined8 *local_e0;
  Vec3fx *local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  ulong local_c0;
  size_type local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  HairSetNode *local_90;
  undefined8 local_88;
  size_type local_80;
  HairSetNode *local_78;
  ulong local_70;
  HairSetNode *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  unsigned_long local_50 [2];
  ulong local_40;
  ulong local_38;
  HairSetNode *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  HairSetNode *local_10;
  undefined1 *local_8;
  
  bVar8 = std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::empty((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_fffffffffffffcc0);
  if (!bVar8) {
    local_228._40_8_ = local_228;
    local_228._8_8_ = 0;
    local_228._16_8_ = 0;
    local_228._24_8_ = 0;
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::vector((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              *)0x367253);
    for (local_248 = 0; uVar1 = local_248,
        sVar9 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)(in_RDI + 0xb8)), uVar1 < sVar9; local_248 = local_248 + 1) {
      for (local_250 = 0; uVar1 = local_250,
          local_178 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0xb8),local_248), uVar1 < local_178->size_active;
          local_250 = local_250 + 1) {
        if (local_250 % 3 == 0) {
          local_180 = (pointer)local_228;
          SceneGraph::HairSetNode::Hair::Hair
                    ((Hair *)((long)&local_270.size_active + 4),(uint)local_228._8_8_,
                     (uint)local_248);
          std::
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ::push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        local_228._88_8_ =
             std::
             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)(in_RDI + 0xb8),local_248);
        uVar6 = local_228._8_8_;
        local_228._80_8_ = local_250;
        local_228._64_8_ = ((reference)local_228._88_8_)->items + local_250;
        in_stack_fffffffffffffd28 = (HairSetNode *)local_228;
        local_d0 = local_228 + 0x30;
        local_228._48_8_ = *(undefined8 *)&((Vec3fx *)local_228._64_8_)->field_0;
        local_228._56_8_ = *(size_type *)((long)&((Vec3fx *)local_228._64_8_)->field_0 + 8);
        uVar1 = local_228._8_8_;
        local_38 = local_228._8_8_ + 1;
        local_228._72_8_ = in_stack_fffffffffffffd28;
        local_d8 = (Vec3fx *)local_228._64_8_;
        local_30 = in_stack_fffffffffffffd28;
        if ((ulong)local_228._16_8_ < local_38) {
          uVar7 = local_38;
          if (local_228._16_8_ != 0) {
            local_40 = local_228._16_8_;
            while (local_40 < local_38) {
              local_50[1] = 1;
              local_50[0] = local_40 << 1;
              puVar10 = std::max<unsigned_long>(local_50 + 1,local_50);
              local_40 = *puVar10;
            }
            local_28 = local_40;
            uVar7 = local_28;
          }
        }
        else {
          uVar7 = local_228._16_8_;
        }
        local_28 = uVar7;
        local_a0 = local_28;
        local_98 = uVar1;
        local_90 = in_stack_fffffffffffffd28;
        if ((ulong)uVar6 <
            (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
            super___atomic_base<unsigned_long>._M_i) {
          while (local_a8 = uVar1,
                local_a8 <
                (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
                super___atomic_base<unsigned_long>._M_i) {
            uVar1 = local_a8 + 1;
          }
          (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
          super___atomic_base<unsigned_long>._M_i = uVar6;
        }
        in_stack_fffffffffffffd30 = in_stack_fffffffffffffd28;
        if (local_a0 == *(ulong *)&(in_stack_fffffffffffffd28->super_Node).fileName) {
          for (local_b0 = (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
                          super___atomic_base<unsigned_long>._M_i; local_b0 < local_98;
              local_b0 = local_b0 + 1) {
            local_20 = (in_stack_fffffffffffffd28->super_Node).fileName._M_string_length +
                       local_b0 * 0x10;
          }
          (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
          super___atomic_base<unsigned_long>._M_i = local_98;
        }
        else {
          local_b8 = (in_stack_fffffffffffffd28->super_Node).fileName._M_string_length;
          local_70 = local_a0;
          local_68 = in_stack_fffffffffffffd28;
          in_stack_fffffffffffffd20 =
               (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                *)alignedMalloc((size_t)in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0)
          ;
          (in_stack_fffffffffffffd28->super_Node).fileName._M_string_length =
               (size_type)in_stack_fffffffffffffd20;
          for (local_c0 = 0;
              local_c0 <
              (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
              super___atomic_base<unsigned_long>._M_i; local_c0 = local_c0 + 1) {
            local_58 = (undefined8 *)
                       ((in_stack_fffffffffffffd28->super_Node).fileName._M_string_length +
                       local_c0 * 0x10);
            local_60 = (undefined8 *)(local_b8 + local_c0 * 0x10);
            uVar6 = local_60[1];
            *local_58 = *local_60;
            local_58[1] = uVar6;
          }
          for (local_c8 = (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
                          super___atomic_base<unsigned_long>._M_i; local_c8 < local_98;
              local_c8 = local_c8 + 1) {
            local_18 = (in_stack_fffffffffffffd28->super_Node).fileName._M_string_length +
                       local_c8 * 0x10;
          }
          local_88 = *(undefined8 *)&(in_stack_fffffffffffffd28->super_Node).fileName;
          local_80 = local_b8;
          local_78 = in_stack_fffffffffffffd28;
          alignedFree(in_stack_fffffffffffffca8);
          (in_stack_fffffffffffffd28->super_Node).super_RefCount.refCounter.
          super___atomic_base<unsigned_long>._M_i = local_98;
          *(ulong *)&(in_stack_fffffffffffffd28->super_Node).fileName = local_a0;
        }
        sVar2 = (in_stack_fffffffffffffd30->super_Node).fileName._M_string_length;
        _Var3 = (in_stack_fffffffffffffd30->super_Node).super_RefCount.refCounter.
                super___atomic_base<unsigned_long>._M_i;
        (in_stack_fffffffffffffd30->super_Node).super_RefCount.refCounter.
        super___atomic_base<unsigned_long>._M_i = _Var3 + 1;
        local_e0 = (undefined8 *)(sVar2 + _Var3 * 0x10);
        local_e8 = local_228 + 0x30;
        *local_e0 = local_228._48_8_;
        local_e0[1] = local_228._56_8_;
      }
    }
    pHVar11 = (HairSetNode *)operator_new(0x118);
    local_288[0xf] = 1;
    local_1a8 = (pointer)(in_RDI + 0xf0);
    pvVar12 = (pointer)(local_288 + 0x10);
    plVar4 = *(long **)local_1a8;
    local_1a0 = pvVar12;
    if (plVar4 != (long *)0x0) {
      lVar5 = *(long *)local_288._16_8_;
      local_288._16_8_ = plVar4;
      (**(code **)(lVar5 + 0x10))();
      plVar4 = (long *)local_288._16_8_;
    }
    local_288._16_8_ = plVar4;
    tbs = (uchar *)0x19;
    SceneGraph::HairSetNode::HairSetNode
              (in_stack_fffffffffffffd30,(avector<Vertex> *)in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd20,(Ref<embree::SceneGraph::MaterialNode> *)pHVar11,
               (RTCGeometryType)((ulong)pvVar12 >> 0x20));
    local_288[0xf] = 0;
    local_168 = (pointer)(local_288 + 0x18);
    local_170 = pHVar11;
    local_270._0_8_ = pHVar11;
    if (pHVar11 != (HairSetNode *)0x0) {
      (**(code **)&(((MaterialNode *)(pHVar11->super_Node).super_RefCount._vptr_RefCount)->
                   super_Node).fileName)();
    }
    local_1b8 = local_288 + 0x10;
    if ((long *)local_288._16_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_288._16_8_ + 0x18))();
    }
    local_158 = (pointer)local_288;
    local_160 = (pointer)(local_288 + 0x18);
    local_10 = (HairSetNode *)local_270._0_8_;
    local_8 = local_288;
    local_288._0_8_ = local_270._0_8_;
    pHVar11 = (HairSetNode *)local_270._0_8_;
    if ((HairSetNode *)local_270._0_8_ != (HairSetNode *)0x0) {
      (**(code **)&(((MaterialNode *)(((Node *)local_270._0_8_)->super_RefCount)._vptr_RefCount)->
                   super_Node).fileName)();
    }
    ctx = (EVP_PKEY_CTX *)local_288;
    SceneGraph::GroupNode::add
              (in_stack_fffffffffffffcb8,(Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffffcb0)
    ;
    local_190 = (pointer)local_288;
    sig = extraout_RDX;
    if ((HairSetNode *)local_288._0_8_ != (HairSetNode *)0x0) {
      (*(code *)(((MaterialNode *)(((Node *)local_288._0_8_)->super_RefCount)._vptr_RefCount)->
                super_Node).fileName._M_string_length)();
      sig = extraout_RDX_00;
    }
    local_150 = (pointer)(local_288 + 0x18);
    SceneGraph::HairSetNode::verify
              ((HairSetNode *)local_270._0_8_,ctx,sig,(size_t)pHVar11,tbs,in_R9);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::clear((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             *)0x367b09);
    local_148 = (pointer)(local_288 + 0x18);
    if ((HairSetNode *)local_270._0_8_ != (HairSetNode *)0x0) {
      (**(code **)((long)(((Node *)local_270._0_8_)->super_RefCount)._vptr_RefCount + 0x18))();
    }
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::~vector(in_stack_fffffffffffffcc0);
    local_1c8 = (MaterialNode *)local_228;
    for (local_128._M_i = 0; local_128._M_i < (ulong)local_228._8_8_;
        local_128._M_i = local_128._M_i + 1) {
    }
    local_118 = local_228._16_8_;
    local_110 = local_228._24_8_;
    local_120.ptr = local_1c8;
    local_108 = local_1c8;
    alignedFree(in_stack_fffffffffffffca8);
  }
  return;
}

Assistant:

void OBJLoader::flushHairGroup()
   {
     if (curGroupHair.empty()) return;

     avector<Vec3ff> vertices;
     std::vector<SceneGraph::HairSetNode::Hair> curves;
     
     for (size_t i=0; i<curGroupHair.size(); i++) {
       for (size_t j=0; j<curGroupHair[i].size(); j++) {
         if (j%3 == 0) curves.push_back(SceneGraph::HairSetNode::Hair((unsigned int)vertices.size(),(unsigned int)i));
         vertices.push_back(curGroupHair[i][j]);
       }
     }
       
     Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(vertices,curves,curMaterial,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE);
     group->add(mesh.cast<SceneGraph::Node>());
     mesh->verify();
     curGroupHair.clear();
   }